

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void update_nst(int (*array) [8] [5] [5] [5] [5])

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int (*paiVar4) [5];
  int (*paaiVar5) [5] [5];
  int (*paaiVar6) [5] [5];
  int (*paaaiVar7) [5] [5] [5];
  long lVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int (*paaiVar14) [5] [5];
  int *piVar15;
  int (*paaaiVar16) [5] [5] [5];
  int (*paaaaiVar17) [5] [5] [5] [5];
  int (*paaaaiVar18) [5] [5] [5] [5];
  int (*paaaaiVar19) [5] [5] [5] [5];
  int (*paaaaiVar20) [5] [5] [5] [5];
  int (*paaaaiVar21) [5] [5] [5] [5];
  int *piVar22;
  int *piVar23;
  long lVar24;
  long lVar25;
  int (*paaaaiVar26) [5] [5] [5] [5];
  int iVar27;
  int (*paiVar28) [5];
  int (*paiVar29) [5];
  int (*paiVar30) [5];
  int iVar31;
  long lVar32;
  int *piVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  int *piVar38;
  int *piVar39;
  int *piVar40;
  int (*paaaaiVar41) [5] [5] [5] [5];
  int *piVar42;
  int (*paaaaiVar43) [5] [5] [5] [5];
  int *piVar44;
  int (*paaaaiVar45) [5] [5] [5] [5];
  int (*paaaaiVar46) [5] [5] [5] [5];
  int iVar47;
  int *piVar48;
  int *piVar49;
  int (*paaiVar50) [5] [5];
  
  piVar2 = array[1][1][1][1][1] + 1;
  lVar8 = 1;
  do {
    lVar3 = 1;
    piVar9 = piVar2;
    do {
      lVar24 = 1;
      piVar10 = piVar9;
      piVar12 = piVar9;
      do {
        lVar37 = 1;
        piVar11 = piVar10;
        piVar38 = piVar12;
        piVar13 = piVar10;
        do {
          lVar32 = 1;
          piVar15 = piVar11;
          piVar33 = piVar11;
          piVar39 = piVar38;
          piVar23 = piVar13;
          do {
            iVar27 = -10000000;
            lVar25 = 0;
            iVar34 = -10000000;
            iVar47 = -10000000;
            iVar36 = -10000000;
            piVar22 = piVar33;
            piVar40 = piVar39;
            piVar42 = piVar23;
            do {
              iVar31 = piVar15[lVar25];
              if (piVar15[lVar25] < iVar36) {
                iVar31 = iVar36;
              }
              iVar36 = iVar31;
              iVar31 = *piVar22;
              if (*piVar22 < iVar47) {
                iVar31 = iVar47;
              }
              iVar47 = iVar31;
              iVar31 = *piVar42;
              if (*piVar42 < iVar34) {
                iVar31 = iVar34;
              }
              iVar34 = iVar31;
              iVar31 = *piVar40;
              if (*piVar40 < iVar27) {
                iVar31 = iVar27;
              }
              iVar27 = iVar31;
              lVar25 = lVar25 + 1;
              piVar22 = piVar22 + 5;
              piVar42 = piVar42 + 0x19;
              piVar40 = piVar40 + 0x7d;
            } while (lVar25 != 4);
            array[lVar8][lVar3][lVar24][lVar37][lVar32][0] = iVar36;
            array[lVar8][lVar3][lVar24][lVar37][0][lVar32] = iVar47;
            array[lVar8][lVar3][lVar24][0][lVar37][lVar32] = iVar34;
            array[lVar8][lVar3][0][lVar24][lVar37][lVar32] = iVar27;
            lVar32 = lVar32 + 1;
            piVar15 = piVar15 + 5;
            piVar33 = piVar33 + 1;
            piVar23 = piVar23 + 1;
            piVar39 = piVar39 + 1;
          } while (lVar32 != 5);
          lVar37 = lVar37 + 1;
          piVar11 = piVar11 + 0x19;
          piVar13 = piVar13 + 5;
          piVar38 = piVar38 + 5;
        } while (lVar37 != 5);
        lVar24 = lVar24 + 1;
        piVar10 = piVar10 + 0x7d;
        piVar12 = piVar12 + 0x19;
      } while (lVar24 != 5);
      lVar3 = lVar3 + 1;
      piVar9 = piVar9 + 0x271;
    } while (lVar3 != 7);
    lVar8 = lVar8 + 1;
    piVar2 = piVar2 + 5000;
  } while (lVar8 != 7);
  paiVar4 = array[1][1][1][1] + 1;
  piVar2 = array[1][1][0][1][1] + 1;
  piVar9 = array[1][1][1][0][1] + 1;
  piVar10 = array[1][1][1][1][0] + 1;
  lVar8 = 1;
  do {
    lVar3 = 1;
    piVar12 = piVar2;
    piVar11 = piVar9;
    paiVar28 = paiVar4;
    piVar38 = piVar10;
    do {
      lVar24 = 1;
      piVar13 = piVar12;
      piVar15 = piVar11;
      paiVar29 = paiVar28;
      piVar33 = piVar38;
      piVar39 = piVar11;
      do {
        lVar37 = 1;
        piVar23 = piVar13;
        paiVar30 = paiVar29;
        piVar22 = piVar15;
        piVar40 = piVar13;
        piVar42 = piVar33;
        piVar48 = piVar39;
        do {
          iVar27 = -10000000;
          lVar25 = 0;
          lVar32 = 0;
          iVar47 = -10000000;
          iVar36 = -10000000;
          iVar35 = -10000000;
          iVar31 = -10000000;
          iVar34 = -10000000;
          piVar44 = piVar42;
          piVar49 = piVar48;
          do {
            iVar1 = *(int *)((long)*paiVar30 + lVar32);
            if (iVar1 < iVar34) {
              iVar1 = iVar34;
            }
            iVar34 = iVar1;
            iVar1 = *piVar44;
            if (*piVar44 < iVar31) {
              iVar1 = iVar31;
            }
            iVar31 = iVar1;
            iVar1 = *piVar49;
            if (*piVar49 < iVar35) {
              iVar1 = iVar35;
            }
            iVar35 = iVar1;
            iVar1 = *(int *)((long)piVar23 + lVar25);
            if (*(int *)((long)piVar23 + lVar25) < iVar36) {
              iVar1 = iVar36;
            }
            iVar36 = iVar1;
            iVar1 = *(int *)((long)piVar40 + lVar32);
            if (*(int *)((long)piVar40 + lVar32) < iVar47) {
              iVar1 = iVar47;
            }
            iVar47 = iVar1;
            iVar1 = *(int *)((long)piVar22 + lVar25);
            if (*(int *)((long)piVar22 + lVar25) < iVar27) {
              iVar1 = iVar27;
            }
            iVar27 = iVar1;
            lVar32 = lVar32 + 0x14;
            lVar25 = lVar25 + 4;
            piVar44 = piVar44 + 0x19;
            piVar49 = piVar49 + 0x7d;
          } while (lVar32 != 0x50);
          array[lVar8][lVar3][lVar24][lVar37][0][0] = iVar34;
          array[lVar8][lVar3][lVar24][0][0][lVar37] = iVar31;
          array[lVar8][lVar3][0][0][lVar24][lVar37] = iVar35;
          array[lVar8][lVar3][lVar24][0][lVar37][0] = iVar27;
          array[lVar8][lVar3][0][lVar24][0][lVar37] = iVar47;
          array[lVar8][lVar3][0][lVar24][lVar37][0] = iVar36;
          lVar37 = lVar37 + 1;
          paiVar30 = paiVar30 + 5;
          piVar23 = piVar23 + 5;
          piVar40 = piVar40 + 1;
          piVar22 = piVar22 + 5;
          piVar42 = piVar42 + 1;
          piVar48 = piVar48 + 1;
        } while (lVar37 != 5);
        lVar24 = lVar24 + 1;
        paiVar29 = paiVar29 + 0x19;
        piVar13 = piVar13 + 0x19;
        piVar15 = piVar15 + 0x7d;
        piVar33 = piVar33 + 0x7d;
        piVar39 = piVar39 + 5;
      } while (lVar24 != 5);
      lVar3 = lVar3 + 1;
      paiVar28 = paiVar28 + 0x7d;
      piVar12 = piVar12 + 0x271;
      piVar11 = piVar11 + 0x271;
      piVar38 = piVar38 + 0x271;
    } while (lVar3 != 7);
    lVar8 = lVar8 + 1;
    paiVar4 = paiVar4 + 1000;
    piVar2 = piVar2 + 5000;
    piVar9 = piVar9 + 5000;
    piVar10 = piVar10 + 5000;
  } while (lVar8 != 7);
  paaiVar5 = array[1][1][1] + 1;
  paiVar4 = array[1][1][0][1] + 1;
  piVar2 = array[1][1][0][0][1] + 1;
  lVar8 = 1;
  do {
    lVar3 = 1;
    paaiVar14 = paaiVar5;
    piVar9 = piVar2;
    paiVar28 = paiVar4;
    do {
      lVar24 = 1;
      paaiVar6 = paaiVar14;
      piVar10 = piVar9;
      piVar12 = piVar9;
      paiVar29 = paiVar28;
      do {
        iVar34 = -10000000;
        lVar37 = 0;
        iVar27 = -10000000;
        iVar47 = -10000000;
        iVar36 = -10000000;
        piVar11 = piVar12;
        paaiVar50 = paaiVar6;
        do {
          iVar31 = (*paaiVar50)[0][0];
          if (iVar31 < iVar36) {
            iVar31 = iVar36;
          }
          iVar36 = iVar31;
          iVar31 = *(int *)((long)*paiVar29 + lVar37);
          if (iVar31 < iVar47) {
            iVar31 = iVar47;
          }
          iVar47 = iVar31;
          iVar31 = *piVar11;
          if (*piVar11 < iVar27) {
            iVar31 = iVar27;
          }
          iVar27 = iVar31;
          iVar31 = *(int *)((long)piVar10 + lVar37);
          if (*(int *)((long)piVar10 + lVar37) < iVar34) {
            iVar31 = iVar34;
          }
          iVar34 = iVar31;
          paaiVar50 = paaiVar50 + 1;
          lVar37 = lVar37 + 0x14;
          piVar11 = piVar11 + 1;
        } while (lVar37 != 0x50);
        array[lVar8][lVar3][lVar24][0][0][0] = iVar36;
        array[lVar8][lVar3][0][lVar24][0][0] = iVar47;
        array[lVar8][lVar3][0][0][lVar24][0] = iVar27;
        array[lVar8][lVar3][0][0][0][lVar24] = iVar34;
        lVar24 = lVar24 + 1;
        paaiVar6 = paaiVar6 + 5;
        paiVar29 = paiVar29 + 5;
        piVar12 = piVar12 + 5;
        piVar10 = piVar10 + 1;
      } while (lVar24 != 5);
      lVar3 = lVar3 + 1;
      paaiVar14 = paaiVar14 + 0x19;
      paiVar28 = paiVar28 + 0x7d;
      piVar9 = piVar9 + 0x271;
    } while (lVar3 != 7);
    lVar8 = lVar8 + 1;
    paaiVar5 = paaiVar5 + 200;
    paiVar4 = paiVar4 + 1000;
    piVar2 = piVar2 + 5000;
  } while (lVar8 != 7);
  paaaiVar7 = array[1][1] + 1;
  lVar8 = 1;
  do {
    lVar3 = 1;
    paaaiVar16 = paaaiVar7;
    do {
      iVar27 = -10000000;
      lVar24 = 0;
      do {
        iVar34 = *(int *)((long)(*paaaiVar16)[0][0] + lVar24);
        if (iVar34 < iVar27) {
          iVar34 = iVar27;
        }
        iVar27 = iVar34;
        lVar24 = lVar24 + 500;
      } while (lVar24 != 2000);
      array[lVar8][lVar3][0][0][0][0] = iVar27;
      lVar3 = lVar3 + 1;
      paaaiVar16 = paaaiVar16 + 5;
    } while (lVar3 != 7);
    lVar8 = lVar8 + 1;
    paaaiVar7 = paaaiVar7 + 0x28;
  } while (lVar8 != 7);
  paaaaiVar17 = array[1] + 1;
  lVar8 = 1;
  paaaaiVar26 = paaaaiVar17;
  do {
    lVar3 = 0;
    paaaaiVar18 = paaaaiVar17;
    paaaaiVar21 = paaaaiVar26;
    do {
      lVar24 = 0;
      paaaaiVar19 = paaaaiVar18;
      paaaaiVar45 = paaaaiVar21;
      do {
        lVar37 = 0;
        paaaaiVar20 = paaaaiVar19;
        paaaaiVar46 = paaaaiVar45;
        do {
          lVar32 = 0;
          paaaaiVar41 = paaaaiVar20;
          paaaaiVar43 = paaaaiVar46;
          do {
            iVar34 = -10000000;
            lVar25 = 0;
            iVar27 = -10000000;
            do {
              iVar36 = *(int *)((long)(*paaaaiVar43)[0][0][0] + lVar25);
              if (iVar36 < iVar27) {
                iVar36 = iVar27;
              }
              iVar27 = iVar36;
              iVar36 = (*paaaaiVar41)[0][0][0][lVar25 * 2];
              if (iVar36 < iVar34) {
                iVar36 = iVar34;
              }
              iVar34 = iVar36;
              lVar25 = lVar25 + 0x9c4;
            } while (lVar25 != 15000);
            array[lVar8][7][lVar3][lVar24][lVar37][lVar32] = iVar27;
            array[7][lVar8][lVar3][lVar24][lVar37][lVar32] = iVar34;
            lVar32 = lVar32 + 1;
            paaaaiVar43 = (int (*) [5] [5] [5] [5])((*paaaaiVar43)[0][0][0] + 1);
            paaaaiVar41 = (int (*) [5] [5] [5] [5])((*paaaaiVar41)[0][0][0] + 1);
          } while (lVar32 != 5);
          lVar37 = lVar37 + 1;
          paaaaiVar46 = (int (*) [5] [5] [5] [5])((*paaaaiVar46)[0][0] + 1);
          paaaaiVar20 = (int (*) [5] [5] [5] [5])((*paaaaiVar20)[0][0] + 1);
        } while (lVar37 != 5);
        lVar24 = lVar24 + 1;
        paaaaiVar45 = (int (*) [5] [5] [5] [5])((*paaaaiVar45)[0] + 1);
        paaaaiVar19 = (int (*) [5] [5] [5] [5])((*paaaaiVar19)[0] + 1);
      } while (lVar24 != 5);
      lVar3 = lVar3 + 1;
      paaaaiVar21 = (int (*) [5] [5] [5] [5])(*paaaaiVar21 + 1);
      paaaaiVar18 = (int (*) [5] [5] [5] [5])(*paaaaiVar18 + 1);
    } while (lVar3 != 5);
    lVar8 = lVar8 + 1;
    paaaaiVar26 = paaaaiVar26 + 8;
    paaaaiVar17 = paaaaiVar17 + 1;
  } while (lVar8 != 7);
  paaaaiVar17 = array[7] + 1;
  lVar8 = 0;
  do {
    lVar3 = 0;
    paaaaiVar26 = paaaaiVar17;
    do {
      lVar24 = 0;
      paaaaiVar18 = paaaaiVar26;
      do {
        lVar37 = 0;
        paaaaiVar21 = paaaaiVar18;
        do {
          iVar27 = -10000000;
          lVar32 = 0;
          do {
            iVar34 = *(int *)((long)(*paaaaiVar21)[0][0][0] + lVar32);
            if (iVar34 < iVar27) {
              iVar34 = iVar27;
            }
            iVar27 = iVar34;
            lVar32 = lVar32 + 0x9c4;
          } while (lVar32 != 15000);
          array[7][7][lVar8][lVar3][lVar24][lVar37] = iVar27;
          lVar37 = lVar37 + 1;
          paaaaiVar21 = (int (*) [5] [5] [5] [5])((*paaaaiVar21)[0][0][0] + 1);
        } while (lVar37 != 5);
        lVar24 = lVar24 + 1;
        paaaaiVar18 = (int (*) [5] [5] [5] [5])((*paaaaiVar18)[0][0] + 1);
      } while (lVar24 != 5);
      lVar3 = lVar3 + 1;
      paaaaiVar26 = (int (*) [5] [5] [5] [5])((*paaaaiVar26)[0] + 1);
    } while (lVar3 != 5);
    lVar8 = lVar8 + 1;
    paaaaiVar17 = (int (*) [5] [5] [5] [5])(*paaaaiVar17 + 1);
  } while (lVar8 != 5);
  return;
}

Assistant:

PRIVATE void
update_nst(int array[NBPAIRS + 1][NBPAIRS + 1][5][5][5][5])
{
  int i, j, k, l, m, n;
  int max, max2, max3, max4, max5, max6;

  /* get maxima for one nonstandard nucleotide */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        for (l = 1; l < 5; l++) {
          for (m = 1; m < 5; m++) {
            max = max2 = max3 = max4 = -INF; /* max of {CGAU} */
            for (n = 1; n < 5; n++) {
              max   = MAX2(max, array[i][j][k][l][m][n]);
              max2  = MAX2(max2, array[i][j][k][l][n][m]);
              max3  = MAX2(max3, array[i][j][k][n][l][m]);
              max4  = MAX2(max4, array[i][j][n][k][l][m]);
            }
            array[i][j][k][l][m][0] = max;
            array[i][j][k][l][0][m] = max2;
            array[i][j][k][0][l][m] = max3;
            array[i][j][0][k][l][m] = max4;
          }
        }
      }
    }
  }
  /* get maxima for two nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        for (l = 1; l < 5; l++) {
          max = max2 = max3 = max4 = max5 = max6 = -INF; /* max of {CGAU} */
          for (m = 1; m < 5; m++) {
            max   = MAX2(max, array[i][j][k][l][m][0]);
            max2  = MAX2(max2, array[i][j][k][m][0][l]);
            max3  = MAX2(max3, array[i][j][m][0][k][l]);
            max4  = MAX2(max4, array[i][j][0][k][l][m]);
            max5  = MAX2(max5, array[i][j][0][k][m][l]);
            max6  = MAX2(max6, array[i][j][k][0][l][m]);
          }
          array[i][j][k][l][0][0] = max;
          array[i][j][k][0][0][l] = max2;
          array[i][j][0][0][k][l] = max3;
          array[i][j][k][0][l][0] = max6;
          array[i][j][0][k][0][l] = max5;
          array[i][j][0][k][l][0] = max4;
        }
      }
    }
  }
  /* get maxima for three nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        max = max2 = max3 = max4 = -INF; /* max of {CGAU} */
        for (l = 1; l < 5; l++) {
          /* should be arbitrary where index l resides in last 3 possible locations */
          max   = MAX2(max, array[i][j][k][l][0][0]);
          max2  = MAX2(max2, array[i][j][0][k][l][0]);
          max3  = MAX2(max3, array[i][j][0][0][k][l]);
          max4  = MAX2(max4, array[i][j][0][0][l][k]);
        }
        array[i][j][k][0][0][0] = max;
        array[i][j][0][k][0][0] = max2;
        array[i][j][0][0][k][0] = max3;
        array[i][j][0][0][0][k] = max4;
      }
    }
  }
  /* get maxima for 4 nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      max = -INF; /* max of {CGAU} */
      for (k = 1; k < 5; k++)
        max = MAX2(max, array[i][j][k][0][0][0]);
      array[i][j][0][0][0][0] = max;
    }
  }

  /*
   * now compute contributions for nonstandard base pairs ...
   * first, 1 nonstandard bp
   */
  for (i = 1; i < NBPAIRS; i++) {
    for (k = 0; k < 5; k++) {
      for (l = 0; l < 5; l++) {
        for (m = 0; m < 5; m++) {
          for (n = 0; n < 5; n++) {
            max = max2 = -INF;
            for (j = 1; j < NBPAIRS; j++) {
              max   = MAX2(max, array[i][j][k][l][m][n]);
              max2  = MAX2(max2, array[j][i][k][l][m][n]);
            }
            array[i][NBPAIRS][k][l][m][n] = max;
            array[NBPAIRS][i][k][l][m][n] = max2;
          }
        }
      }
    }
  }

  /* now 2 nst base pairs */
  for (k = 0; k < 5; k++) {
    for (l = 0; l < 5; l++) {
      for (m = 0; m < 5; m++) {
        for (n = 0; n < 5; n++) {
          max = -INF;
          for (j = 1; j < NBPAIRS; j++)
            max = MAX2(max, array[NBPAIRS][j][k][l][m][n]);
          array[NBPAIRS][NBPAIRS][k][l][m][n] = max;
        }
      }
    }
  }
}